

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M2Data.cpp
# Opt level: O2

bool __thiscall M2Data::parse_file_name(M2Data *this,char *monthly_csv_file_name)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  M2DataType MVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  int i;
  uint uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  char **ppcVar14;
  ulong uVar15;
  bool bVar16;
  
  sVar7 = strlen(monthly_csv_file_name);
  if (sVar7 < 4) {
    iVar12 = 0;
    iVar10 = 0;
    iVar4 = 0;
    iVar6 = 0;
    bVar16 = false;
    uVar15 = 0;
  }
  else {
    ppcVar14 = file_suffix;
    for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
      pcVar2 = *ppcVar14;
      sVar8 = strlen(pcVar2);
      if ((sVar8 < sVar7) &&
         (iVar4 = strcmp(monthly_csv_file_name + (sVar7 - sVar8),pcVar2), iVar4 == 0)) {
        MVar5 = *(M2DataType *)((long)file_type + lVar11);
        this->M2Type = MVar5;
        goto LAB_001742cb;
      }
      ppcVar14 = ppcVar14 + 1;
    }
    MVar5 = this->M2Type;
    sVar8 = 0;
LAB_001742cb:
    iVar12 = (int)sVar8;
    bVar16 = MVar5 != UnknownM2Type;
    uVar15 = 0;
    iVar4 = 0;
    while ((iVar10 = iVar4, bVar16 && ((uint)uVar15 < 4))) {
      pbVar1 = (byte *)(monthly_csv_file_name + uVar15);
      uVar15 = uVar15 + 1;
      iVar4 = iVar10 * 10 + -0x30 + (uint)*pbVar1;
      if ((byte)(*pbVar1 - 0x3a) < 0xf6) {
        bVar16 = false;
        iVar4 = iVar10;
      }
    }
    iVar4 = 0;
    if (iVar10 - 0x80aU < 0xffffffd7) {
      bVar16 = false;
    }
    if ((bVar16) && (pcVar2 = monthly_csv_file_name + uVar15, uVar15 = uVar15 + 1, *pcVar2 != '-'))
    {
      bVar16 = false;
    }
    if (bVar16) {
      if (MVar5 == TLD_old) {
        iVar6 = 1;
        ppcVar14 = month_names;
        for (lVar11 = 0; iVar4 = 0, lVar11 != 0x30; lVar11 = lVar11 + 4) {
          pcVar2 = *ppcVar14;
          sVar8 = strlen(pcVar2);
          if ((sVar8 + uVar15 < sVar7) &&
             (iVar4 = strncmp(monthly_csv_file_name + uVar15,pcVar2,sVar8), iVar4 == 0)) {
            iVar4 = *(int *)((long)month_day + lVar11);
            uVar15 = sVar8 + uVar15;
            goto LAB_00174490;
          }
          iVar6 = iVar6 + 1;
          ppcVar14 = ppcVar14 + 1;
        }
        iVar6 = 0;
        bVar16 = false;
      }
      else {
        iVar6 = 0;
        for (uVar9 = 0; (bVar16 && (uVar9 < 2)); uVar9 = uVar9 + 1) {
          pbVar1 = (byte *)(monthly_csv_file_name + uVar15);
          uVar15 = uVar15 + 1;
          iVar4 = iVar6 * 10 + -0x30 + (uint)*pbVar1;
          if ((byte)(*pbVar1 - 0x3a) < 0xf6) {
            bVar16 = false;
            iVar4 = iVar6;
          }
          iVar6 = iVar4;
        }
        if (iVar6 - 0xdU < 0xfffffff4) {
          bVar16 = false;
        }
        if ((bVar16) &&
           (pcVar2 = monthly_csv_file_name + uVar15, uVar15 = uVar15 + 1, *pcVar2 != '-')) {
          bVar16 = false;
        }
        iVar4 = 0;
        for (uVar9 = 0; (bVar16 && (uVar9 < 2)); uVar9 = uVar9 + 1) {
          pbVar1 = (byte *)(monthly_csv_file_name + uVar15);
          uVar15 = uVar15 + 1;
          iVar3 = iVar4 * 10 + -0x30 + (uint)*pbVar1;
          if ((byte)(*pbVar1 - 0x3a) < 0xf6) {
            bVar16 = false;
            iVar3 = iVar4;
          }
          iVar4 = iVar3;
        }
        if (iVar4 - 0x20U < 0xffffffe1) {
          bVar16 = false;
        }
      }
    }
    else {
      iVar6 = 0;
    }
  }
LAB_00174490:
  bVar13 = false;
  if ((long)iVar12 + uVar15 == sVar7) {
    bVar13 = bVar16;
  }
  if (!bVar16) {
    bVar13 = bVar16;
  }
  if (bVar13 != false) {
    this->year = iVar10;
    this->month = iVar6;
    this->day = iVar4;
  }
  return bVar13;
}

Assistant:

bool M2Data::parse_file_name(char const * monthly_csv_file_name)
{
    bool ret = true;
    size_t len = strlen(monthly_csv_file_name);
    size_t char_index = 0;
    int y = 0;
    int m = 0;
    int d = 0;
    int suffix_len = 0;

    if (len < 4)
    {
        ret = false;
    }
    else
    {
        for (int i = 0; i < 3; i++)
        {
            size_t sl = strlen(file_suffix[i]);
            if (sl < len && strcmp(monthly_csv_file_name + len - sl, file_suffix[i]) == 0)
            {
                M2Type = file_type[i];
                suffix_len = (int) sl;
                break;
            }
        }

        if (M2Type == UnknownM2Type)
        {
            ret = false;
        }

        for (int i = 0; ret && i < 4; i++)
        {
            char c = monthly_csv_file_name[char_index++];

            if (c < '0' || c > '9')
            {
                ret = false;
            }
            else
            {
                y *= 10;
                y += c - '0';
            }
        }

        if (y < 2017 || y > 2057)
        {
            ret = false;
        }
    }

    if (ret && monthly_csv_file_name[char_index++] != '-')
    {
        ret = false;
    }

    if (ret)
    {
        if (M2Type == TLD_old)
        {
            for (int i = 0; i < 12; i++)
            {
                size_t ml = strlen(month_names[i]);
                if ((char_index + ml) < len &&
                    strncmp(&monthly_csv_file_name[char_index], month_names[i], ml) == 0)
                {
                    m = i+1;
                    char_index += ml;
                    break;
                }
            }


            if (m <= 0)
            {
                ret = false;
            }
            else
            {
                d = month_day[m-1];
            }
        }
        else
        {
            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    m *= 10;
                    m += c - '0';
                }
            }

            if (m <= 0 || m > 12)
            {
                ret = false;
            }

            if (ret && monthly_csv_file_name[char_index++] != '-')
            {
                ret = false;
            }

            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    d *= 10;
                    d += c - '0';
                }
            }

            if (d <= 0 || d > 31)
            {
                ret = false;
            }
        }
    }

    if (ret && char_index+suffix_len != len)
    {
        ret = false;
    }

    if (ret)
    {
        year = y;
        month = m;
        day = d;
    }

    return ret;
}